

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall
kwssys::RegularExpression::deep_equal(RegularExpression *this,RegularExpression *rxp)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  RegularExpressionMatch *in_RSI;
  RegularExpressionMatch *in_RDI;
  int ind;
  bool local_29;
  int local_1c;
  
  local_1c = *(int *)(in_RDI[1].startp + 4);
  if (*(int *)(in_RDI[1].startp + 4) == *(int *)(in_RSI[1].startp + 4)) {
    do {
      iVar3 = local_1c + -1;
      if (local_1c == 0) {
        sVar1 = RegularExpressionMatch::start(in_RDI);
        sVar2 = RegularExpressionMatch::start(in_RSI);
        local_29 = false;
        if (sVar1 == sVar2) {
          sVar1 = RegularExpressionMatch::end(in_RDI);
          sVar2 = RegularExpressionMatch::end(in_RSI);
          local_29 = sVar1 == sVar2;
        }
        return local_29;
      }
      local_1c = iVar3;
    } while (in_RDI[1].startp[3][iVar3] == in_RSI[1].startp[3][iVar3]);
  }
  return false;
}

Assistant:

bool RegularExpression::deep_equal(const RegularExpression& rxp) const
{
  int ind = this->progsize;                     // Get regular expression size
  if (ind != rxp.progsize)                      // If different size regexp
    return false;                               // Return failure
  while (ind-- != 0)                            // Else while still characters
    if (this->program[ind] != rxp.program[ind]) // If regexp are different
      return false;                             // Return failure
  // Else if same start/end ptrs, return true
  return (this->regmatch.start() == rxp.regmatch.start() &&
          this->regmatch.end() == rxp.regmatch.end());
}